

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

int __thiscall CGlyphMap::GetCharGlyph(CGlyphMap *this,int Chr,FT_Face_conflict *pFace)

{
  FT_Face_conflict pFVar1;
  int iVar2;
  FT_Face_conflict *ppFVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)Chr;
  iVar2 = FT_Get_Char_Index(this->m_DefaultFace,lVar5);
  pFVar1 = this->m_DefaultFace;
  *pFace = pFVar1;
  if (iVar2 == 0 && pFVar1 != (FT_Face_conflict)0x0) {
    if ((this->m_VariantFace != (FT_Face_conflict)0x0) &&
       (iVar2 = FT_Get_Char_Index(this->m_VariantFace,lVar5), iVar2 != 0)) {
      ppFVar3 = &this->m_VariantFace;
LAB_0012fd70:
      *pFace = *ppFVar3;
      return iVar2;
    }
    iVar2 = this->m_NumFallbackFaces;
    if (0 < iVar2) {
      ppFVar3 = this->m_aFallbackFaces;
      lVar4 = 0;
      do {
        if (*ppFVar3 != (FT_Face_conflict)0x0) {
          iVar2 = FT_Get_Char_Index(*ppFVar3,lVar5);
          if (iVar2 != 0) goto LAB_0012fd70;
          iVar2 = this->m_NumFallbackFaces;
        }
        lVar4 = lVar4 + 1;
        ppFVar3 = ppFVar3 + 1;
      } while (lVar4 < iVar2);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int CGlyphMap::GetCharGlyph(int Chr, FT_Face *pFace)
{
	int GlyphIndex = FT_Get_Char_Index(m_DefaultFace, (FT_ULong)Chr);
	*pFace = m_DefaultFace;

	if(!m_DefaultFace || GlyphIndex)
		return GlyphIndex;

	if(m_VariantFace)
	{
		GlyphIndex = FT_Get_Char_Index(m_VariantFace, (FT_ULong)Chr);
		if(GlyphIndex)
		{
			*pFace = m_VariantFace;
			return GlyphIndex;
		}
	}

	for(int i = 0; i < m_NumFallbackFaces; ++i)
	{
		if(m_aFallbackFaces[i])
		{
			GlyphIndex = FT_Get_Char_Index(m_aFallbackFaces[i], (FT_ULong)Chr);
			if(GlyphIndex)
			{
				*pFace = m_aFallbackFaces[i];
				return GlyphIndex;
			}
		}
	}

	return 0;
}